

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O3

bool pd::readSynonymDict(string *dict_filename,
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *dict)

{
  pointer *s_00;
  pointer pbVar1;
  char cVar2;
  ostream *poVar3;
  istream *piVar4;
  long lVar5;
  pointer pcVar6;
  undefined8 uVar7;
  string *s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr__;
  undefined4 uVar8;
  int iVar9;
  long local_2b0;
  ifstream fi;
  uint auStack_290 [122];
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  synonims;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coords;
  string line;
  
  std::ifstream::ifstream(&local_2b0,(string *)dict_filename,_S_in);
  lVar5 = *(long *)(local_2b0 + -0x18);
  uVar8 = *(uint *)((long)auStack_290 + lVar5);
  if ((uVar8 & 5) == 0) {
    coords.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    s_00 = &coords.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    line.field_2._12_4_ = uVar8;
    while( true ) {
      __return_storage_ptr__ =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&word.field_2 + 8);
      cVar2 = std::ios::widen((char)lVar5 + (char)&stack0xfffffffffffffff8 + 'X');
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_2b0,(string *)s_00,cVar2);
      if ((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) ||
         (line._M_dataplus._M_p == (pointer)0x0)) break;
      lVar5 = std::__cxx11::string::find_last_not_of((char *)s_00,0x114109,0xffffffffffffffff);
      pcVar6 = (pointer)(lVar5 + 1);
      if (line._M_dataplus._M_p < pcVar6) {
        uVar7 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase",pcVar6);
        std::ifstream::~ifstream(&local_2b0);
        _Unwind_Resume(uVar7);
      }
      pcVar6[(long)&(coords.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus] = '\0';
      line._M_dataplus._M_p = pcVar6;
      ex::split(__return_storage_ptr__,(string *)s_00,'|');
      synonims.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&word._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 &synonims.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,*(long *)word.field_2._8_8_,
                 *(long *)(word.field_2._8_8_ + 8) + *(long *)word.field_2._8_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(__return_storage_ptr__,(iterator)word.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (word.field_2._8_8_ + 0x20));
      pbVar1 = coords.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auStack_a8 = (undefined1  [8])0x0;
      synonims.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      synonims.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((pointer)word.field_2._8_8_ !=
          coords.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        iVar9 = 0;
        uVar7 = word.field_2._8_8_;
        do {
          cVar2 = (char)uVar7;
          lVar5 = std::__cxx11::string::find(cVar2,0x20);
          if (((lVar5 == -1) && (lVar5 = std::__cxx11::string::find(cVar2,0x28), lVar5 == -1)) &&
             (lVar5 = std::__cxx11::string::find(cVar2,0x29), lVar5 == -1)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_a8,(value_type *)uVar7);
            iVar9 = iVar9 + 1;
            if (iVar9 == 5) break;
          }
          uVar7 = uVar7 + 0x20;
        } while ((pointer)uVar7 != pbVar1);
      }
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)dict,&synonims.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_a8);
      if (synonims.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&word._M_string_length) {
        operator_delete(synonims.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&word.field_2 + 8));
      lVar5 = *(long *)(local_2b0 + -0x18);
    }
    uVar8 = line.field_2._12_4_;
    if (coords.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&line._M_string_length) {
      operator_delete(coords.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar8 = line.field_2._12_4_;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dict_filename->_M_dataplus)._M_p,
                        dict_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," doesn\'t exist",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::ifstream::~ifstream(&local_2b0);
  return (uVar8 & 5) == 0;
}

Assistant:

bool readSynonymDict(const std::string& dict_filename, std::unordered_map<std::string, std::vector<std::string>>& dict) 
    {
        std::ifstream fi(dict_filename);
        if (not fi)
        {
            std::cerr << "File " << dict_filename << " doesn't exist" << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(fi, line) and !line.empty())
        {
            //boost::algorithm::trim(line);
            line.erase(line.find_last_not_of(" \n\r\t")+1);
            //std::cout << line << std::endl;
            std::vector<std::string> coords = ex::split(line, '|');
            std::string word = coords[0];
            coords.erase(coords.begin(), coords.begin() + 1);
            uint32_t num_words = 0;
            std::vector<std::string> synonims;
            for (const std::string& s: coords)
            {
                if (s.find(' ') != std::string::npos or s.find('(') != std::string::npos or s.find(')') != std::string::npos)
                    continue;
                synonims.push_back(s);    
                num_words++;
                if (num_words == 5)
                    break;
            }
            
            dict.emplace(word, synonims);               
        }
        return true;
    }